

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct>::ConvertToStruct
          (JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct> *this)

{
  bool bVar1;
  vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *in_RSI;
  DecodePsbtInputStruct *in_RDI;
  DecodePsbtInputStruct data;
  DecodePsbtInput *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct> *__range3;
  vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *result;
  vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>
  *in_stack_fffffffffffffb98;
  DecodePsbtInputStruct *__x;
  DecodePsbtInput *in_stack_ffffffffffffff98;
  __normal_iterator<const_cfd::api::json::DecodePsbtInput_*,_std::vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>_>
  local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  ::std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>::vector
            ((vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *)0x6c04ce);
  local_28[0]._M_current =
       (DecodePsbtInput *)
       ::std::
       vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>::
       begin(in_stack_fffffffffffffb98);
  ::std::vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>::
  end(in_stack_fffffffffffffb98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::api::json::DecodePsbtInput_*,_std::vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_cfd::api::json::DecodePsbtInput_*,_std::vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>_>
                             *)in_stack_fffffffffffffb98), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::DecodePsbtInput_*,_std::vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>_>
    ::operator*(local_28);
    cfd::api::json::DecodePsbtInput::ConvertToStruct(in_stack_ffffffffffffff98);
    ::std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>::push_back
              (in_RSI,__x);
    DecodePsbtInputStruct::~DecodePsbtInputStruct(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::DecodePsbtInput_*,_std::vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>_>
    ::operator++(local_28);
  }
  return (vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *)__x;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }